

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O3

bool __thiscall fast_float::bigint::mul(bigint *this,limb y)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = (this->vec).length;
  uVar6 = (ulong)uVar1;
  bVar5 = true;
  if (uVar6 != 0) {
    uVar8 = 0;
    uVar7 = 0;
    do {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = y;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->vec).data[uVar8];
      auVar4 = auVar2 * auVar3 + auVar4;
      uVar7 = auVar4._8_8_;
      (this->vec).data[uVar8] = auVar4._0_8_;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
    if (uVar7 != 0) {
      if (uVar1 < 0x3e) {
        (this->vec).data[uVar6] = uVar7;
        (this->vec).length = uVar1 + 1;
      }
      else {
        bVar5 = false;
      }
    }
  }
  return bVar5;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool mul(limb y) noexcept {
    return small_mul(vec, y);
  }